

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O3

int Abc_MfsSatAddXor(sat_solver *pSat,int iVarA,int iVarB,int iVarC)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  lit Lits [3];
  int local_3c;
  int local_38;
  int local_34;
  
  iVar4 = iVarA * 2 + 1;
  iVar1 = iVarB * 2 + 1;
  iVar2 = iVarC * 2 + 1;
  local_3c = iVar4;
  local_38 = iVar1;
  local_34 = iVar2;
  iVar3 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
  uVar5 = 0;
  if (iVar3 != 0) {
    local_3c = iVar4;
    local_38 = iVarB * 2;
    local_34 = iVarC * 2;
    iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
    if (iVar4 == 0) {
      uVar5 = 0;
    }
    else {
      local_3c = iVarA * 2;
      local_38 = iVar1;
      local_34 = iVarC * 2;
      iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
      uVar5 = 0;
      if (iVar4 != 0) {
        local_3c = iVarA * 2;
        local_38 = iVarB * 2;
        local_34 = iVar2;
        iVar4 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
        uVar5 = (uint)(iVar4 != 0);
      }
    }
  }
  return uVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Adds constraints for the two-input AND-gate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_MfsSatAddXor( sat_solver * pSat, int iVarA, int iVarB, int iVarC )
{
    lit Lits[3];

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}